

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_namelist.cc
# Opt level: O2

MissingListType * ctemplate::TemplateNamelist::GetMissingList_abi_cxx11_(bool refresh)

{
  string *unresolved;
  bool bVar1;
  NameListType *pNVar2;
  ostream *poVar3;
  __node_base *p_Var4;
  allocator local_71;
  string path;
  string local_50 [32];
  
  if (missing_list__abi_cxx11_ ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    missing_list__abi_cxx11_ =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)operator_new(0x18);
    (missing_list__abi_cxx11_->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (missing_list__abi_cxx11_->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (missing_list__abi_cxx11_->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else if (!refresh) goto LAB_001308d3;
  pNVar2 = GetList_abi_cxx11_();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(missing_list__abi_cxx11_);
  p_Var4 = &(pNVar2->_M_h)._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    unresolved = (string *)(p_Var4 + 1);
    Template::FindTemplateFilename(&path,unresolved);
    if ((path._M_string_length == 0) || (bVar1 = File::Readable(path._M_dataplus._M_p), !bVar1)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(missing_list__abi_cxx11_,unresolved);
      poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR");
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = std::operator<<(poVar3,"Template file missing: ");
      poVar3 = std::operator<<(poVar3,(string *)unresolved);
      poVar3 = std::operator<<(poVar3," at path: ");
      if (path._M_string_length == 0) {
        std::__cxx11::string::string(local_50,"(empty path)",&local_71);
      }
      else {
        std::__cxx11::string::string(local_50,(string *)&path);
      }
      poVar3 = std::operator<<(poVar3,local_50);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string(local_50);
    }
    std::__cxx11::string::~string((string *)&path);
  }
LAB_001308d3:
  std::
  __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((missing_list__abi_cxx11_->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (missing_list__abi_cxx11_->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  return missing_list__abi_cxx11_;
}

Assistant:

const TemplateNamelist::MissingListType& TemplateNamelist::GetMissingList(
    bool refresh) {
  if (!missing_list_) {
    missing_list_ = new MissingListType;
    refresh = true;  // always refresh the first time
  }

  if (refresh) {
    const NameListType& the_list = TemplateNamelist::GetList();
    missing_list_->clear();

    for (NameListType::const_iterator iter = the_list.begin();
         iter != the_list.end();
         ++iter) {
      const string path = Template::FindTemplateFilename(*iter);
      if (path.empty() || !File::Readable(path.c_str())) {
        missing_list_->push_back(*iter);
        LOG(ERROR) << "Template file missing: " << *iter
                   << " at path: " << (path.empty() ? "(empty path)" : path)
                   << "\n";
      }
    }
  }

  sort(missing_list_->begin(), missing_list_->end());
  return *missing_list_;
}